

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Response * __thiscall Filer_::handle(Response *__return_storage_ptr__,Filer_ *this,Request *request)

{
  _Rb_tree_header *p_Var1;
  
  __return_storage_ptr__->status = OK;
  (__return_storage_ptr__->body)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->body).field_2
  ;
  (__return_storage_ptr__->body)._M_string_length = 0;
  (__return_storage_ptr__->body).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->header)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->header)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->header)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->header)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->header)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->header)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->fsize = 0;
  __return_storage_ptr__->file = (FILE *)0x0;
  Neyn::Filer::operator()((Request *)this,(Response *)request);
  return __return_storage_ptr__;
}

Assistant:

Response handle(const Request &request)
    {
        Response response;
        Filer::operator()(const_cast<Request &>(request), response);
        return response;
    }